

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O2

void __thiscall t_json_generator::init_generator(t_json_generator *this)

{
  int iVar1;
  int *piVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  char *__rhs;
  int __oflag;
  allocator local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string f_json_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(&f_json_name,this);
  iVar1 = mkdir(f_json_name._M_dataplus._M_p,0x1ff);
  std::__cxx11::string::~string((string *)&f_json_name);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    if (*piVar2 != 0x11) {
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      (*(this->super_t_generator)._vptr_t_generator[0x1b])(&local_40,this);
      std::__cxx11::string::string((string *)&local_80,local_40._M_dataplus._M_p,&local_81);
      std::operator+(&f_json_name,&local_80,": ");
      __rhs = strerror(*piVar2);
      std::operator+(__return_storage_ptr__,&f_json_name,__rhs);
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(&local_40,this);
  std::operator+(&local_80,&local_40,&((this->super_t_generator).program_)->name_);
  std::operator+(&f_json_name,&local_80,".json");
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string
            ((string *)&local_80,f_json_name._M_dataplus._M_p,(allocator *)&local_40);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&this->f_json_,(char *)&local_80,__oflag);
  std::__cxx11::string::~string((string *)&local_80);
  if (this->should_merge_includes_ == true) {
    merge_includes(this,(this->super_t_generator).program_);
  }
  std::__cxx11::string::~string((string *)&f_json_name);
  return;
}

Assistant:

void t_json_generator::init_generator() {
  MKDIR(get_out_dir().c_str());

  string f_json_name = get_out_dir() + program_->get_name() + ".json";
  f_json_.open(f_json_name.c_str());

  // Merge all included programs into this one so we can output one big file.
  if (should_merge_includes_) {
    merge_includes(program_);
  }
}